

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

void __thiscall soplex::SSVectorBase<double>::clearIdx(SSVectorBase<double> *this,int i)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  int in_ESI;
  SSVectorBase<double> *in_RDI;
  int n;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = isSetup(in_RDI);
  if ((bVar1) &&
     (uVar2 = pos((SSVectorBase<double> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                  (int)((ulong)in_RDI >> 0x20)), -1 < (int)uVar2)) {
    IdxSet::remove(&in_RDI->super_IdxSet,(char *)(ulong)uVar2);
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&(in_RDI->super_VectorBase<double>).val,(long)in_ESI);
  *pvVar3 = 0.0;
  return;
}

Assistant:

void clearIdx(int i)
   {
      if(isSetup())
      {
         int n = pos(i);

         if(n >= 0)
            remove(n);
      }

      VectorBase<R>::val[i] = 0;

      assert(isConsistent());
   }